

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_mixer.cpp
# Opt level: O0

void __thiscall
MixerContext::MixerContext
          (MixerContext *this,cubeb_sample_format f,uint32_t in_channels,cubeb_channel_layout in,
          uint32_t out_channels,cubeb_channel_layout out)

{
  cubeb_channel_layout cVar1;
  uint uVar2;
  int iVar3;
  cubeb_channel_layout in_ECX;
  uint32_t in_EDX;
  cubeb_sample_format in_ESI;
  EVP_PKEY_CTX *ctx;
  MixerContext *in_RDI;
  uint32_t in_R8D;
  cubeb_channel_layout in_R9D;
  
  in_RDI->_format = in_ESI;
  cVar1 = cubeb_channel_layout_check(in_ECX,in_EDX);
  in_RDI->_in_ch_layout = cVar1;
  cVar1 = cubeb_channel_layout_check(in_R9D,in_R8D);
  in_RDI->_out_ch_layout = cVar1;
  in_RDI->_in_ch_count = in_EDX;
  in_RDI->_out_ch_count = in_R8D;
  in_RDI->_surround_mix_level = 0.70710677;
  in_RDI->_center_mix_level = 0.70710677;
  in_RDI->_lfe_mix_level = 1.0;
  memcpy(in_RDI->_matrix,&DAT_00170498,0x2000);
  memcpy(in_RDI->_matrix_flt,&DAT_00172498,0x1000);
  memcpy(in_RDI->_matrix32,&DAT_00173498,0x1000);
  ctx = (EVP_PKEY_CTX *)&DAT_00174498;
  memcpy(in_RDI->_matrix_ch,&DAT_00174498,0x420);
  in_RDI->_clipping = false;
  in_RDI->_valid = false;
  uVar2 = cubeb_channel_layout_nb_channels(in_ECX);
  if ((in_EDX == uVar2) && (uVar2 = cubeb_channel_layout_nb_channels(in_R9D), in_R8D == uVar2)) {
    iVar3 = init(in_RDI,ctx);
    in_RDI->_valid = -1 < iVar3;
  }
  return;
}

Assistant:

MixerContext(cubeb_sample_format f,
               uint32_t in_channels,
               cubeb_channel_layout in,
               uint32_t out_channels,
               cubeb_channel_layout out)
    : _format(f)
    , _in_ch_layout(cubeb_channel_layout_check(in, in_channels))
    , _out_ch_layout(cubeb_channel_layout_check(out, out_channels))
    , _in_ch_count(in_channels)
    , _out_ch_count(out_channels)
  {
    if (in_channels != cubeb_channel_layout_nb_channels(in) ||
        out_channels != cubeb_channel_layout_nb_channels(out)) {
      // Mismatch between channels and layout, aborting.
      return;
    }
    _valid = init() >= 0;
  }